

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

void __thiscall
Assimp::ASEImporter::BuildAnimations
          (ASEImporter *this,
          vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *nodes)

{
  void *pvVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  Logger *pLVar8;
  aiAnimation **ppaVar9;
  aiAnimation *this_00;
  aiNodeAnim **ppaVar10;
  reference ppBVar11;
  size_type sVar12;
  ulong uVar13;
  aiNodeAnim *paVar14;
  ulong uVar15;
  aiVectorKey *paVar16;
  reference pvVar17;
  aiQuatKey *paVar18;
  reference pvVar19;
  aiQuaterniont<float> *paVar20;
  double *pdVar21;
  long lVar22;
  aiVectorKey *local_1a0;
  aiQuatKey *local_178;
  aiVectorKey *local_148;
  aiVectorKey *local_110;
  undefined1 local_d0 [24];
  aiQuatKey q;
  undefined1 auStack_a0 [4];
  uint a;
  aiQuaternion cur;
  aiNodeAnim *nd_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  aiNodeAnim *local_58;
  aiNodeAnim *nd;
  BaseNode *me;
  BaseNode **local_40;
  aiAnimation *local_38;
  aiAnimation *pcAnim;
  uint local_24;
  const_iterator cStack_20;
  uint iNum;
  const_iterator i;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *nodes_local;
  ASEImporter *this_local;
  
  i._M_current = (BaseNode **)nodes;
  cStack_20 = std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::begin
                        (nodes);
  local_24 = 0;
  do {
    pcAnim = (aiAnimation *)
             std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::end
                       ((vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *
                        )i._M_current);
    bVar7 = __gnu_cxx::operator!=
                      (&stack0xffffffffffffffe0,
                       (__normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
                        *)&pcAnim);
    if (!bVar7) {
      if (local_24 != 0) {
        this->pcScene->mNumAnimations = 1;
        ppaVar9 = (aiAnimation **)operator_new__(8);
        this->pcScene->mAnimations = ppaVar9;
        this_00 = (aiAnimation *)operator_new(0x448);
        aiAnimation::aiAnimation(this_00);
        *this->pcScene->mAnimations = this_00;
        this_00->mNumChannels = local_24;
        local_38 = this_00;
        ppaVar10 = (aiNodeAnim **)operator_new__((ulong)local_24 << 3);
        local_38->mChannels = ppaVar10;
        local_38->mTicksPerSecond =
             (double)(this->mParser->iFrameSpeed * this->mParser->iTicksPerFrame);
        local_24 = 0;
        local_40 = (BaseNode **)
                   std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::
                   begin(i._M_current);
        cStack_20 = (const_iterator)local_40;
        while( true ) {
          me = (BaseNode *)
               std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::end
                         ((vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
                           *)i._M_current);
          bVar7 = __gnu_cxx::operator!=
                            (&stack0xffffffffffffffe0,
                             (__normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
                              *)&me);
          if (!bVar7) break;
          ppBVar11 = __gnu_cxx::
                     __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
                     ::operator*(&stack0xffffffffffffffe0);
          nd = (aiNodeAnim *)*ppBVar11;
          sVar12 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                             ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                              ((nd->mNodeName).data + 0x11c));
          if ((1 < sVar12) &&
             (bVar7 = is_not_qnan<float>(*(float *)((nd->mNodeName).data + 0x84)), bVar7)) {
            paVar14 = (aiNodeAnim *)operator_new(0x438);
            aiNodeAnim::aiNodeAnim(paVar14);
            uVar13 = (ulong)local_24;
            local_24 = local_24 + 1;
            local_38->mChannels[uVar13] = paVar14;
            local_58 = paVar14;
            std::operator+(&local_78,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((nd->mNodeName).data + 4),".Target");
            aiString::Set((aiString *)paVar14,&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            sVar12 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                               ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                                ((nd->mNodeName).data + 0x11c));
            local_58->mNumPositionKeys = (uint)sVar12;
            uVar13 = CONCAT44(0,local_58->mNumPositionKeys);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar13;
            uVar15 = SUB168(auVar3 * ZEXT816(0x18),0);
            if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
              uVar15 = 0xffffffffffffffff;
            }
            paVar16 = (aiVectorKey *)operator_new__(uVar15);
            if (uVar13 != 0) {
              local_110 = paVar16;
              do {
                aiVectorKey::aiVectorKey(local_110);
                local_110 = local_110 + 1;
              } while (local_110 != paVar16 + uVar13);
            }
            local_58->mPositionKeys = paVar16;
            paVar16 = local_58->mPositionKeys;
            pvVar17 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                                ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                                 ((nd->mNodeName).data + 0x11c),0);
            memcpy(paVar16,pvVar17,(ulong)local_58->mNumPositionKeys * 0x18);
          }
          sVar12 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                             ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                              ((nd->mNodeName).data + 0xc4));
          if (((1 < sVar12) ||
              (sVar12 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::size
                                  ((vector<aiQuatKey,_std::allocator<aiQuatKey>_> *)
                                   ((nd->mNodeName).data + 0xac)), 1 < sVar12)) ||
             (sVar12 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                                 ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                                  ((nd->mNodeName).data + 0xdc)), 1 < sVar12)) {
            paVar14 = (aiNodeAnim *)operator_new(0x438);
            aiNodeAnim::aiNodeAnim(paVar14);
            local_38->mChannels[local_24] = paVar14;
            cur._8_8_ = paVar14;
            local_24 = local_24 + 1;
            aiString::Set((aiString *)paVar14,(string *)((nd->mNodeName).data + 4));
            sVar12 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                               ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                                ((nd->mNodeName).data + 0xc4));
            if (1 < sVar12) {
              sVar12 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                                 ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                                  ((nd->mNodeName).data + 0xc4));
              *(int *)(cur._8_8_ + 0x404) = (int)sVar12;
              uVar13 = CONCAT44(0,*(uint *)(cur._8_8_ + 0x404));
              auVar4._8_8_ = 0;
              auVar4._0_8_ = uVar13;
              uVar15 = SUB168(auVar4 * ZEXT816(0x18),0);
              if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
                uVar15 = 0xffffffffffffffff;
              }
              paVar16 = (aiVectorKey *)operator_new__(uVar15);
              if (uVar13 != 0) {
                local_148 = paVar16;
                do {
                  aiVectorKey::aiVectorKey(local_148);
                  local_148 = local_148 + 1;
                } while (local_148 != paVar16 + uVar13);
              }
              *(aiVectorKey **)(cur._8_8_ + 0x408) = paVar16;
              pvVar1 = *(void **)(cur._8_8_ + 0x408);
              pvVar17 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                                  ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                                   ((nd->mNodeName).data + 0xc4),0);
              memcpy(pvVar1,pvVar17,(ulong)*(uint *)(cur._8_8_ + 0x404) * 0x18);
            }
            sVar12 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::size
                               ((vector<aiQuatKey,_std::allocator<aiQuatKey>_> *)
                                ((nd->mNodeName).data + 0xac));
            if (1 < sVar12) {
              sVar12 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::size
                                 ((vector<aiQuatKey,_std::allocator<aiQuatKey>_> *)
                                  ((nd->mNodeName).data + 0xac));
              *(int *)(cur._8_8_ + 0x410) = (int)sVar12;
              uVar13 = CONCAT44(0,*(uint *)(cur._8_8_ + 0x410));
              auVar5._8_8_ = 0;
              auVar5._0_8_ = uVar13;
              uVar15 = SUB168(auVar5 * ZEXT816(0x18),0);
              if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
                uVar15 = 0xffffffffffffffff;
              }
              paVar18 = (aiQuatKey *)operator_new__(uVar15);
              if (uVar13 != 0) {
                local_178 = paVar18;
                do {
                  aiQuatKey::aiQuatKey(local_178);
                  local_178 = local_178 + 1;
                } while (local_178 != paVar18 + uVar13);
              }
              *(aiQuatKey **)(cur._8_8_ + 0x418) = paVar18;
              aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)auStack_a0);
              for (q.mValue.z = 0.0; (uint)q.mValue.z < (uint)*(float *)(cur._8_8_ + 0x410);
                  q.mValue.z = (float)((int)q.mValue.z + 1)) {
                pvVar19 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::operator[]
                                    ((vector<aiQuatKey,_std::allocator<aiQuatKey>_> *)
                                     ((nd->mNodeName).data + 0xac),(ulong)(uint)q.mValue.z);
                dVar2 = pvVar19->mTime;
                q.mTime = *(double *)&pvVar19->mValue;
                q.mValue.w = (pvVar19->mValue).y;
                q.mValue.x = (pvVar19->mValue).z;
                local_d0._0_16_ = *(undefined1 (*) [16])&pvVar19->mValue;
                if (0x6e < this->mParser->iFileFormat) {
                  if (q.mValue.z != 0.0) {
                    local_d0._0_16_ =
                         (undefined1  [16])
                         aiQuaterniont<float>::operator*
                                   ((aiQuaterniont<float> *)auStack_a0,(aiQuaterniont<float> *)&q);
                  }
                  auVar3 = local_d0._0_16_;
                  auStack_a0 = (undefined1  [4])local_d0._0_4_;
                  a = local_d0._4_4_;
                  local_d0._8_8_ = auVar3._8_8_;
                  cur.w = (float)local_d0._8_4_;
                  cur.x = (float)local_d0._12_4_;
                  paVar20 = aiQuaterniont<float>::Normalize((aiQuaterniont<float> *)auStack_a0);
                  q.mTime = *(double *)paVar20;
                  q.mValue.w = paVar20->y;
                  q.mValue.x = paVar20->z;
                }
                pdVar21 = (double *)(*(long *)(cur._8_8_ + 0x418) + (ulong)(uint)q.mValue.z * 0x18);
                *pdVar21 = dVar2;
                pdVar21[1] = q.mTime;
                pdVar21[2] = (double)q.mValue._0_8_;
                lVar22 = *(long *)(cur._8_8_ + 0x418) + (ulong)(uint)q.mValue.z * 0x18;
                *(float *)(lVar22 + 8) = *(float *)(lVar22 + 8) * -1.0;
              }
            }
            sVar12 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                               ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                                ((nd->mNodeName).data + 0xdc));
            if (1 < sVar12) {
              sVar12 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                                 ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                                  ((nd->mNodeName).data + 0xdc));
              *(int *)(cur._8_8_ + 0x420) = (int)sVar12;
              uVar13 = CONCAT44(0,*(uint *)(cur._8_8_ + 0x420));
              auVar6._8_8_ = 0;
              auVar6._0_8_ = uVar13;
              uVar15 = SUB168(auVar6 * ZEXT816(0x18),0);
              if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
                uVar15 = 0xffffffffffffffff;
              }
              paVar16 = (aiVectorKey *)operator_new__(uVar15);
              if (uVar13 != 0) {
                local_1a0 = paVar16;
                do {
                  aiVectorKey::aiVectorKey(local_1a0);
                  local_1a0 = local_1a0 + 1;
                } while (local_1a0 != paVar16 + uVar13);
              }
              *(aiVectorKey **)(cur._8_8_ + 0x428) = paVar16;
              pvVar1 = *(void **)(cur._8_8_ + 0x428);
              pvVar17 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                                  ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                                   ((nd->mNodeName).data + 0xdc),0);
              memcpy(pvVar1,pvVar17,(ulong)*(uint *)(cur._8_8_ + 0x420) * 0x18);
            }
          }
          __gnu_cxx::
          __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
          ::operator++(&stack0xffffffffffffffe0);
        }
      }
      return;
    }
    ppBVar11 = __gnu_cxx::
               __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
               ::operator*(&stack0xffffffffffffffe0);
    if (((*ppBVar11)->mAnim).mPositionType != TRACK) {
      pLVar8 = DefaultLogger::get();
      Logger::warn(pLVar8,"ASE: Position controller uses Bezier/TCB keys. This is not supported.");
    }
    ppBVar11 = __gnu_cxx::
               __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
               ::operator*(&stack0xffffffffffffffe0);
    if (((*ppBVar11)->mAnim).mRotationType != TRACK) {
      pLVar8 = DefaultLogger::get();
      Logger::warn(pLVar8,"ASE: Rotation controller uses Bezier/TCB keys. This is not supported.");
    }
    ppBVar11 = __gnu_cxx::
               __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
               ::operator*(&stack0xffffffffffffffe0);
    if (((*ppBVar11)->mAnim).mScalingType != TRACK) {
      pLVar8 = DefaultLogger::get();
      Logger::warn(pLVar8,"ASE: Position controller uses Bezier/TCB keys. This is not supported.");
    }
    ppBVar11 = __gnu_cxx::
               __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
               ::operator*(&stack0xffffffffffffffe0);
    sVar12 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                       (&((*ppBVar11)->mAnim).akeyPositions);
    if (sVar12 < 2) {
      ppBVar11 = __gnu_cxx::
                 __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
                 ::operator*(&stack0xffffffffffffffe0);
      sVar12 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::size
                         (&((*ppBVar11)->mAnim).akeyRotations);
      if (1 < sVar12) goto LAB_006007c6;
      ppBVar11 = __gnu_cxx::
                 __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
                 ::operator*(&stack0xffffffffffffffe0);
      sVar12 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                         (&((*ppBVar11)->mAnim).akeyScaling);
      if (1 < sVar12) goto LAB_006007c6;
    }
    else {
LAB_006007c6:
      local_24 = local_24 + 1;
    }
    ppBVar11 = __gnu_cxx::
               __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
               ::operator*(&stack0xffffffffffffffe0);
    sVar12 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                       (&((*ppBVar11)->mTargetAnim).akeyPositions);
    if (1 < sVar12) {
      ppBVar11 = __gnu_cxx::
                 __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
                 ::operator*(&stack0xffffffffffffffe0);
      bVar7 = is_not_qnan<float>(((*ppBVar11)->mTargetPosition).x);
      if (bVar7) {
        local_24 = local_24 + 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
    ::operator++(&stack0xffffffffffffffe0);
  } while( true );
}

Assistant:

void ASEImporter::BuildAnimations(const std::vector<BaseNode*>& nodes)
{
    // check whether we have at least one mesh which has animations
    std::vector<ASE::BaseNode*>::const_iterator i =  nodes.begin();
    unsigned int iNum = 0;
    for (;i != nodes.end();++i) {

        // TODO: Implement Bezier & TCB support
        if ((*i)->mAnim.mPositionType != ASE::Animation::TRACK) {
            ASSIMP_LOG_WARN("ASE: Position controller uses Bezier/TCB keys. "
                "This is not supported.");
        }
        if ((*i)->mAnim.mRotationType != ASE::Animation::TRACK) {
            ASSIMP_LOG_WARN("ASE: Rotation controller uses Bezier/TCB keys. "
                "This is not supported.");
        }
        if ((*i)->mAnim.mScalingType != ASE::Animation::TRACK)  {
            ASSIMP_LOG_WARN("ASE: Position controller uses Bezier/TCB keys. "
                "This is not supported.");
        }

        // We compare against 1 here - firstly one key is not
        // really an animation and secondly MAX writes dummies
        // that represent the node transformation.
        if ((*i)->mAnim.akeyPositions.size()>1 || (*i)->mAnim.akeyRotations.size()>1 || (*i)->mAnim.akeyScaling.size()>1){
            ++iNum;
        }
        if ((*i)->mTargetAnim.akeyPositions.size() > 1 && is_not_qnan( (*i)->mTargetPosition.x )) {
            ++iNum;
        }
    }
    if (iNum)   {
        // Generate a new animation channel and setup everything for it
        pcScene->mNumAnimations = 1;
        pcScene->mAnimations    = new aiAnimation*[1];
        aiAnimation* pcAnim     = pcScene->mAnimations[0] = new aiAnimation();
        pcAnim->mNumChannels    = iNum;
        pcAnim->mChannels       = new aiNodeAnim*[iNum];
        pcAnim->mTicksPerSecond = mParser->iFrameSpeed * mParser->iTicksPerFrame;

        iNum = 0;

        // Now iterate through all meshes and collect all data we can find
        for (i =  nodes.begin();i != nodes.end();++i)   {

            ASE::BaseNode* me = *i;
            if ( me->mTargetAnim.akeyPositions.size() > 1 && is_not_qnan( me->mTargetPosition.x ))  {
                // Generate an extra channel for the camera/light target.
                // BuildNodes() does also generate an extra node, named
                // <baseName>.Target.
                aiNodeAnim* nd = pcAnim->mChannels[iNum++] = new aiNodeAnim();
                nd->mNodeName.Set(me->mName + ".Target");

                // If there is no input position channel we will need
                // to supply the default position from the node's
                // local transformation matrix.
                /*TargetAnimationHelper helper;
                if (me->mAnim.akeyPositions.empty())
                {
                    aiMatrix4x4& mat = (*i)->mTransform;
                    helper.SetFixedMainAnimationChannel(aiVector3D(
                        mat.a4, mat.b4, mat.c4));
                }
                else helper.SetMainAnimationChannel (&me->mAnim.akeyPositions);
                helper.SetTargetAnimationChannel (&me->mTargetAnim.akeyPositions);

                helper.Process(&me->mTargetAnim.akeyPositions);*/

                // Allocate the key array and fill it
                nd->mNumPositionKeys = (unsigned int) me->mTargetAnim.akeyPositions.size();
                nd->mPositionKeys = new aiVectorKey[nd->mNumPositionKeys];

                ::memcpy(nd->mPositionKeys,&me->mTargetAnim.akeyPositions[0],
                    nd->mNumPositionKeys * sizeof(aiVectorKey));
            }

            if (me->mAnim.akeyPositions.size() > 1 || me->mAnim.akeyRotations.size() > 1 || me->mAnim.akeyScaling.size() > 1)   {
                // Begin a new node animation channel for this node
                aiNodeAnim* nd = pcAnim->mChannels[iNum++] = new aiNodeAnim();
                nd->mNodeName.Set(me->mName);

                // copy position keys
                if (me->mAnim.akeyPositions.size() > 1 )
                {
                    // Allocate the key array and fill it
                    nd->mNumPositionKeys = (unsigned int) me->mAnim.akeyPositions.size();
                    nd->mPositionKeys = new aiVectorKey[nd->mNumPositionKeys];

                    ::memcpy(nd->mPositionKeys,&me->mAnim.akeyPositions[0],
                        nd->mNumPositionKeys * sizeof(aiVectorKey));
                }
                // copy rotation keys
                if (me->mAnim.akeyRotations.size() > 1 )    {
                    // Allocate the key array and fill it
                    nd->mNumRotationKeys = (unsigned int) me->mAnim.akeyRotations.size();
                    nd->mRotationKeys = new aiQuatKey[nd->mNumRotationKeys];

                    // --------------------------------------------------------------------
                    // Rotation keys are offsets to the previous keys.
                    // We have the quaternion representations of all
                    // of them, so we just need to concatenate all
                    // (unit-length) quaternions to get the absolute
                    // rotations.
                    // Rotation keys are ABSOLUTE for older files
                    // --------------------------------------------------------------------

                    aiQuaternion cur;
                    for (unsigned int a = 0; a < nd->mNumRotationKeys;++a)  {
                        aiQuatKey q = me->mAnim.akeyRotations[a];

                        if (mParser->iFileFormat > 110) {
                            cur = (a ? cur*q.mValue : q.mValue);
                            q.mValue = cur.Normalize();
                        }
                        nd->mRotationKeys[a] = q;

                        // need this to get to Assimp quaternion conventions
                        nd->mRotationKeys[a].mValue.w *= -1.f;
                    }
                }
                // copy scaling keys
                if (me->mAnim.akeyScaling.size() > 1 )  {
                    // Allocate the key array and fill it
                    nd->mNumScalingKeys = (unsigned int) me->mAnim.akeyScaling.size();
                    nd->mScalingKeys = new aiVectorKey[nd->mNumScalingKeys];

                    ::memcpy(nd->mScalingKeys,&me->mAnim.akeyScaling[0],
                        nd->mNumScalingKeys * sizeof(aiVectorKey));
                }
            }
        }
    }
}